

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcePack.cpp
# Opt level: O2

void __thiscall ResourcePack::load_shader(ResourcePack *this,string *name)

{
  string *__k;
  char cVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  int InfoLogLength;
  allocator_type local_975;
  GLint Result;
  string *local_970;
  ResourcePack *local_968;
  char *FragmentSourcePointer;
  string vertex_file_path;
  string FragmentShaderCode;
  string VertexShaderCode;
  string fragment_file_path;
  char *VertexSourcePointer;
  stringstream sstr_1;
  ostream local_8a8 [376];
  ifstream FragmentShaderStream;
  ostream local_720 [504];
  ostringstream fragment_file_path_stream;
  ostringstream vertex_file_path_stream;
  ifstream VertexShaderStream;
  streambuf local_228 [504];
  
  local_968 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vertex_file_path_stream);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fragment_file_path_stream);
  poVar5 = std::operator<<((ostream *)&vertex_file_path_stream,"../res/");
  poVar5 = std::operator<<(poVar5,(string *)name);
  std::operator<<(poVar5,".vert");
  poVar5 = std::operator<<((ostream *)&fragment_file_path_stream,"../res/");
  poVar5 = std::operator<<(poVar5,(string *)name);
  std::operator<<(poVar5,".frag");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  GVar2 = (*__glewCreateShader)(0x8b31);
  GVar3 = (*__glewCreateShader)(0x8b30);
  VertexShaderCode._M_dataplus._M_p = (pointer)&VertexShaderCode.field_2;
  VertexShaderCode._M_string_length = 0;
  VertexShaderCode.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&VertexShaderStream,vertex_file_path._M_dataplus._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::__cxx11::stringstream::stringstream((stringstream *)&FragmentShaderStream);
    std::ostream::operator<<(local_720,local_228);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&VertexShaderCode,(string *)&sstr_1);
    std::__cxx11::string::~string((string *)&sstr_1);
    std::ifstream::close();
    std::__cxx11::stringstream::~stringstream((stringstream *)&FragmentShaderStream);
    FragmentShaderCode._M_dataplus._M_p = (pointer)&FragmentShaderCode.field_2;
    FragmentShaderCode._M_string_length = 0;
    FragmentShaderCode.field_2._M_local_buf[0] = '\0';
    std::ifstream::ifstream(&FragmentShaderStream,fragment_file_path._M_dataplus._M_p,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&sstr_1);
      std::ostream::operator<<(local_8a8,(streambuf *)local_720);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&FragmentShaderCode,(string *)&VertexSourcePointer);
      std::__cxx11::string::~string((string *)&VertexSourcePointer);
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)&sstr_1);
    }
    Result = 0;
    local_970 = name;
    printf("Compiling shader : %s\n",vertex_file_path._M_dataplus._M_p);
    VertexSourcePointer = VertexShaderCode._M_dataplus._M_p;
    (*__glewShaderSource)(GVar2,1,&VertexSourcePointer,(GLint *)0x0);
    (*__glewCompileShader)(GVar2);
    (*__glewGetShaderiv)(GVar2,0x8b81,&Result);
    (*__glewGetShaderiv)(GVar2,0x8b84,&InfoLogLength);
    if (0 < InfoLogLength) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&sstr_1,(ulong)(uint)InfoLogLength + 1,
                 (allocator_type *)&FragmentSourcePointer);
      (*__glewGetShaderInfoLog)(GVar2,InfoLogLength,(GLsizei *)0x0,_sstr_1);
      puts(_sstr_1);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&sstr_1);
    }
    printf("Compiling shader : %s\n",fragment_file_path._M_dataplus._M_p);
    FragmentSourcePointer = FragmentShaderCode._M_dataplus._M_p;
    (*__glewShaderSource)(GVar3,1,&FragmentSourcePointer,(GLint *)0x0);
    (*__glewCompileShader)(GVar3);
    (*__glewGetShaderiv)(GVar3,0x8b81,&Result);
    (*__glewGetShaderiv)(GVar3,0x8b84,&InfoLogLength);
    __k = local_970;
    if (0 < InfoLogLength) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&sstr_1,(ulong)(uint)InfoLogLength + 1,
                 &local_975);
      (*__glewGetShaderInfoLog)(GVar3,InfoLogLength,(GLsizei *)0x0,_sstr_1);
      puts(_sstr_1);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&sstr_1);
    }
    puts("Linking program");
    GVar4 = (*__glewCreateProgram)();
    (*__glewAttachShader)(GVar4,GVar2);
    (*__glewAttachShader)(GVar4,GVar3);
    (*__glewLinkProgram)(GVar4);
    (*__glewGetProgramiv)(GVar4,0x8b82,&Result);
    (*__glewGetProgramiv)(GVar4,0x8b84,&InfoLogLength);
    if (0 < InfoLogLength) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&sstr_1,(ulong)(uint)InfoLogLength + 1,
                 &local_975);
      (*__glewGetProgramInfoLog)(GVar4,InfoLogLength,(GLsizei *)0x0,_sstr_1);
      puts(_sstr_1);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&sstr_1);
    }
    (*__glewDetachShader)(GVar4,GVar2);
    (*__glewDetachShader)(GVar4,GVar3);
    (*__glewDeleteShader)(GVar2);
    (*__glewDeleteShader)(GVar3);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[](&local_968->programs,__k);
    *pmVar6 = GVar4;
    std::ifstream::~ifstream(&FragmentShaderStream);
    std::__cxx11::string::~string((string *)&FragmentShaderCode);
    std::ifstream::~ifstream(&VertexShaderStream);
    std::__cxx11::string::~string((string *)&VertexShaderCode);
    std::__cxx11::string::~string((string *)&fragment_file_path);
    std::__cxx11::string::~string((string *)&vertex_file_path);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fragment_file_path_stream);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vertex_file_path_stream);
    return;
  }
  printf("Could not open shader %s\n",vertex_file_path._M_dataplus._M_p);
  getchar();
  exit(1);
}

Assistant:

void ResourcePack::load_shader(std::string& name) {
    std::ostringstream vertex_file_path_stream, fragment_file_path_stream;
    vertex_file_path_stream << "../res/" << name << ".vert";
    fragment_file_path_stream << "../res/" << name << ".frag";
   
    std::string vertex_file_path = vertex_file_path_stream.str();
    std::string fragment_file_path = fragment_file_path_stream.str();

    // Create the shaders
    GLuint VertexShaderID = glCreateShader(GL_VERTEX_SHADER);
    GLuint FragmentShaderID = glCreateShader(GL_FRAGMENT_SHADER);

    // Read the Vertex Shader code from the file
    std::string VertexShaderCode;
    std::ifstream VertexShaderStream(vertex_file_path.c_str(), std::ios::in);
    if(VertexShaderStream.is_open()) {
        std::stringstream sstr;
        sstr << VertexShaderStream.rdbuf();
        VertexShaderCode = sstr.str();
        VertexShaderStream.close();
    }
    else {
        printf("Could not open shader %s\n", vertex_file_path.c_str());
        getchar();
        exit(1);
    }

    // Read the Fragment Shader code from the file
    std::string FragmentShaderCode;
    std::ifstream FragmentShaderStream(fragment_file_path.c_str(), std::ios::in);
    if(FragmentShaderStream.is_open()){
        std::stringstream sstr;
        sstr << FragmentShaderStream.rdbuf();
        FragmentShaderCode = sstr.str();
        FragmentShaderStream.close();
    }

    GLint Result = GL_FALSE;
    int InfoLogLength;

    // Compile Vertex Shader
    printf("Compiling shader : %s\n", vertex_file_path.c_str());
    char const * VertexSourcePointer = VertexShaderCode.c_str();
    glShaderSource(VertexShaderID, 1, &VertexSourcePointer , NULL);
    glCompileShader(VertexShaderID);

    // Check Vertex Shader
    glGetShaderiv(VertexShaderID, GL_COMPILE_STATUS, &Result);
    glGetShaderiv(VertexShaderID, GL_INFO_LOG_LENGTH, &InfoLogLength);
    if ( InfoLogLength > 0 ){
        std::vector<char> VertexShaderErrorMessage(InfoLogLength+1);
        glGetShaderInfoLog(VertexShaderID, InfoLogLength, NULL, &VertexShaderErrorMessage[0]);
        printf("%s\n", &VertexShaderErrorMessage[0]);
    }

    // Compile Fragment Shader
    printf("Compiling shader : %s\n", fragment_file_path.c_str());
    char const * FragmentSourcePointer = FragmentShaderCode.c_str();
    glShaderSource(FragmentShaderID, 1, &FragmentSourcePointer , NULL);
    glCompileShader(FragmentShaderID);

    // Check Fragment Shader
    glGetShaderiv(FragmentShaderID, GL_COMPILE_STATUS, &Result);
    glGetShaderiv(FragmentShaderID, GL_INFO_LOG_LENGTH, &InfoLogLength);
    if ( InfoLogLength > 0 ){
        std::vector<char> FragmentShaderErrorMessage(InfoLogLength+1);
        glGetShaderInfoLog(FragmentShaderID, InfoLogLength, NULL, &FragmentShaderErrorMessage[0]);
        printf("%s\n", &FragmentShaderErrorMessage[0]);
    }

    // Link the program
    printf("Linking program\n");
    GLuint ProgramID = glCreateProgram();
    glAttachShader(ProgramID, VertexShaderID);
    glAttachShader(ProgramID, FragmentShaderID);
    glLinkProgram(ProgramID);

    // Check the program
    glGetProgramiv(ProgramID, GL_LINK_STATUS, &Result);
    glGetProgramiv(ProgramID, GL_INFO_LOG_LENGTH, &InfoLogLength);
    if (InfoLogLength > 0){
        std::vector<char> ProgramErrorMessage(InfoLogLength+1);
        glGetProgramInfoLog(ProgramID, InfoLogLength, NULL, &ProgramErrorMessage[0]);
        printf("%s\n", &ProgramErrorMessage[0]);
    }

    glDetachShader(ProgramID, VertexShaderID);
    glDetachShader(ProgramID, FragmentShaderID);

    glDeleteShader(VertexShaderID);
    glDeleteShader(FragmentShaderID);

    programs[name] = ProgramID;
}